

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definition.cpp
# Opt level: O1

bool __thiscall slang::ast::Definition::ParameterDecl::hasDefault(ParameterDecl *this)

{
  DeclaratorSyntax *pDVar1;
  ParameterDecl *pPVar2;
  
  if (this->hasSyntax == true) {
    pDVar1 = (this->field_1).valueDecl;
    if (this->isTypeParam == false) {
      if (pDVar1 == (DeclaratorSyntax *)0x0) {
        return false;
      }
      pPVar2 = (ParameterDecl *)&pDVar1->initializer;
    }
    else {
      if (pDVar1 == (DeclaratorSyntax *)0x0) {
        return false;
      }
      pPVar2 = (ParameterDecl *)&pDVar1->dimensions;
    }
  }
  else {
    pPVar2 = (ParameterDecl *)&this->field_1;
    if (this->isTypeParam != false) {
      pPVar2 = this;
    }
  }
  return (pPVar2->field_0).valueSyntax != (ParameterDeclarationSyntax *)0x0;
}

Assistant:

bool Definition::ParameterDecl::hasDefault() const {
    if (hasSyntax) {
        if (isTypeParam)
            return typeDecl && typeDecl->assignment != nullptr;
        else
            return valueDecl && valueDecl->initializer != nullptr;
    }
    else {
        if (isTypeParam)
            return givenType != nullptr;
        else
            return givenInitializer != nullptr;
    }
}